

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_145302::MissingCommandTask::inputsAvailable
          (MissingCommandTask *this,TaskInterface ti)

{
  BuildValue local_a8;
  ValueType local_38;
  MissingCommandTask *local_20;
  MissingCommandTask *this_local;
  TaskInterface ti_local;
  
  ti_local.impl = ti.ctx;
  this_local = (MissingCommandTask *)ti.impl;
  local_20 = this;
  llbuild::buildsystem::BuildValue::makeInvalid();
  llbuild::buildsystem::BuildValue::toData(&local_38,&local_a8);
  llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_38,true);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_38);
  llbuild::buildsystem::BuildValue::~BuildValue(&local_a8);
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    // A missing command always builds to an invalid value, and forces
    // downstream clients to be rebuilt (at which point they will presumably see
    // the command is no longer used).
    return ti.complete(BuildValue::makeInvalid().toData(),
                       /*forceChange=*/true);
  }